

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

void __thiscall cppcms::url_mapper::url_mapper(url_mapper *this,application *my_app)

{
  data *this_00;
  service *this_01;
  cached_settings *pcVar1;
  
  this_00 = (data *)operator_new(0xb8);
  data::data(this_00);
  (this->d).ptr_ = this_00;
  this_00->this_application = my_app;
  this_01 = application::service(my_app);
  pcVar1 = service::cached_settings(this_01);
  ((this->d).ptr_)->throws = (pcVar1->misc).invalid_url_throws;
  return;
}

Assistant:

url_mapper::url_mapper(cppcms::application *my_app) : d(new url_mapper::data())
	{
		d->this_application = my_app;
		d->throws = my_app->service().cached_settings().misc.invalid_url_throws;
	}